

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib572.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  FILE *__stream;
  char *__ptr;
  stat file_info;
  
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
    return 0x7e;
  }
  __ptr = (char *)0x0;
  iVar1 = curl_easy_setopt(lVar3,0x272d,_stdout);
  if (iVar1 != 0) goto LAB_00101308;
  __ptr = (char *)0x0;
  iVar1 = curl_easy_setopt(lVar3,0x2711,_stdout);
  if (iVar1 != 0) goto LAB_00101308;
  __ptr = (char *)0x0;
  iVar1 = curl_easy_setopt(lVar3,0x29,1);
  if (iVar1 != 0) goto LAB_00101308;
  __ptr = (char *)0x0;
  iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
  if (iVar1 != 0) goto LAB_00101308;
  __ptr = suburl(URL,1);
  iVar2 = 0x7e;
  if (__ptr != (char *)0x0) {
    iVar1 = curl_easy_setopt(lVar3,0x27cf,__ptr);
    if (iVar1 != 0) goto LAB_00101308;
    free(__ptr);
    __ptr = (char *)0x0;
    iVar1 = curl_easy_setopt(lVar3,0x27d0,"Planes/Trains/Automobiles");
    if (iVar1 != 0) goto LAB_00101308;
    __ptr = (char *)0x0;
    iVar1 = curl_easy_setopt(lVar3,0xbd,4);
    if (iVar1 != 0) goto LAB_00101308;
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) goto LAB_001013d3;
    __ptr = suburl(URL,2);
    if (__ptr != (char *)0x0) {
      iVar1 = curl_easy_setopt(lVar3,0x27cf,__ptr);
      if (iVar1 != 0) goto LAB_00101308;
      free(__ptr);
      iVar1 = open64("log/file572.txt",0);
      fstat64(iVar1,(stat64 *)&file_info);
      close(iVar1);
      __stream = fopen64("log/file572.txt","rb");
      if (__stream == (FILE *)0x0) {
        __ptr = (char *)0x0;
        curl_mfprintf(_stderr,"can\'t open log/file572.txt\n");
        iVar1 = iVar2;
        goto LAB_00101308;
      }
      iVar1 = curl_easy_setopt(lVar3,0xbd,8);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x2719,__stream), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar3,0x2e,1), iVar1 == 0)) &&
         (((iVar1 = curl_easy_setopt(lVar3,0x75a3,file_info.st_size), iVar1 == 0 &&
           (iVar1 = curl_easy_perform(lVar3), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar3,0x2e,0), iVar1 == 0)))) {
        fclose(__stream);
        __ptr = suburl(URL,3);
        if (__ptr != (char *)0x0) {
          iVar1 = curl_easy_setopt(lVar3,0x27cf,__ptr);
          if (iVar1 != 0) goto LAB_00101308;
          free(__ptr);
          iVar1 = curl_easy_perform(lVar3);
          if (iVar1 != 0) {
LAB_001013d3:
            __ptr = (char *)0x0;
            goto LAB_00101308;
          }
          __ptr = suburl(URL,4);
          if (__ptr != (char *)0x0) {
            iVar1 = curl_easy_setopt(lVar3,0x27cf,__ptr);
            if (iVar1 != 0) goto LAB_00101308;
            free(__ptr);
            __ptr = (char *)0x0;
            iVar1 = curl_easy_setopt(lVar3,0xbd,8);
            if (iVar1 != 0) goto LAB_00101308;
            __ptr = (char *)0x0;
            iVar1 = curl_easy_setopt(lVar3,0x271f,"packets_received\njitter\n");
            if (iVar1 != 0) goto LAB_00101308;
            iVar1 = curl_easy_perform(lVar3);
            if (iVar1 != 0) goto LAB_001013d3;
            __ptr = (char *)0x0;
            iVar1 = curl_easy_setopt(lVar3,0x271f,0);
            if (iVar1 != 0) goto LAB_00101308;
            __ptr = suburl(URL,5);
            if (__ptr != (char *)0x0) {
              iVar1 = curl_easy_setopt(lVar3,0x27cf,__ptr);
              if (iVar1 != 0) goto LAB_00101308;
              free(__ptr);
              __ptr = (char *)0x0;
              iVar1 = curl_easy_setopt(lVar3,0xbd,1);
              if (iVar1 != 0) goto LAB_00101308;
              iVar2 = curl_easy_perform(lVar3);
            }
          }
        }
      }
      else {
        fclose(__stream);
        iVar2 = iVar1;
      }
    }
  }
  __ptr = (char *)0x0;
  iVar1 = iVar2;
LAB_00101308:
  free(__ptr);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  int params;
  FILE *paramsf = NULL;
  struct_stat file_info;
  char *stream_uri = NULL;
  int request=1;
  struct curl_slist *custom_headers=NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }


  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  test_setopt(curl, CURLOPT_URL, URL);

  /* SETUP */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_TRANSPORT, "Planes/Trains/Automobiles");
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  /* PUT style GET_PARAMETERS */
  params = open("log/file572.txt", O_RDONLY);
  fstat(params, &file_info);
  close(params);

  paramsf = fopen("log/file572.txt", "rb");
  if(paramsf == NULL) {
    fprintf(stderr, "can't open log/file572.txt\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_GET_PARAMETER);

  test_setopt(curl, CURLOPT_READDATA, paramsf);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t) file_info.st_size);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_UPLOAD, 0L);
  fclose(paramsf);
  paramsf = NULL;

  /* Heartbeat GET_PARAMETERS */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* POST GET_PARAMETERS */

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_GET_PARAMETER);
  test_setopt(curl, CURLOPT_POSTFIELDS, "packets_received\njitter\n");

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_POSTFIELDS, NULL);

  /* Make sure we can do a normal request now */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_OPTIONS);
  res = curl_easy_perform(curl);

test_cleanup:

  if(paramsf)
    fclose(paramsf);

  free(stream_uri);

  if(custom_headers)
    curl_slist_free_all(custom_headers);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}